

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void dfst(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  uint n_00;
  int nc;
  int iVar14;
  double dVar15;
  double dVar16;
  ulong uVar7;
  
  iVar14 = *ip;
  if (iVar14 * 8 < n) {
    iVar14 = n >> 3;
    makewt(iVar14,ip,w);
  }
  nc = ip[1];
  if (nc * 2 < n) {
    nc = n >> 1;
    makect(nc,ip,w + iVar14);
  }
  if (2 < n) {
    uVar6 = (uint)n >> 1;
    uVar7 = (ulong)uVar6;
    n_00 = (uint)n >> 2;
    uVar5 = (ulong)(uint)n;
    uVar11 = (ulong)n_00;
    if (7 < (uint)n) {
      lVar9 = 1;
      lVar10 = -uVar7;
      lVar8 = uVar7 * 8 + -8;
      lVar13 = 0;
      do {
        lVar10 = lVar10 + 1;
        dVar1 = *(double *)((long)a + lVar13 + uVar5 * 8 + -8);
        dVar15 = a[lVar9] - dVar1;
        dVar2 = *(double *)((long)a + lVar13 + lVar8);
        dVar3 = a[uVar5 + lVar10];
        dVar16 = dVar2 - dVar3;
        a[lVar9] = a[lVar9] + dVar1;
        *(double *)((long)a + lVar13 + lVar8) = dVar2 + dVar3;
        t[lVar9] = dVar15 + dVar16;
        *(double *)((long)t + lVar13 + uVar7 * 8 + -8) = dVar15 - dVar16;
        lVar9 = lVar9 + 1;
        lVar13 = lVar13 + -8;
      } while (uVar11 * 8 + -8 + lVar13 != 0);
    }
    *t = a[uVar11] - a[(int)(n - n_00)];
    a[uVar11] = a[(int)(n - n_00)] + a[uVar11];
    *a = a[uVar7];
    c = w + iVar14;
    dstsub(uVar6,a,nc,c);
    if ((uint)n < 10) {
      if (uVar6 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(uVar6,ip + 2,a);
      cftfsub(uVar6,a,w);
      rftfsub(uVar6,a,nc,c);
    }
    a[uVar5 - 1] = a[1] - *a;
    a[1] = *a + a[1];
    if (7 < (uint)n) {
      lVar10 = uVar7 + 2;
      lVar8 = uVar7 << 3;
      do {
        dVar1 = a[lVar10 + -4];
        *(double *)((long)a + lVar8 * 2 + -0x18) = dVar1 - a[lVar10 + -3];
        *(double *)((long)a + lVar8 * 2 + -0x28) = -dVar1 - a[lVar10 + -3];
        lVar10 = lVar10 + -2;
        lVar8 = lVar8 + -0x10;
      } while (5 < lVar10);
    }
    lVar10 = 2;
    if (7 < (uint)n) {
      iVar14 = 2;
      do {
        dstsub(n_00,t,nc,c);
        if (n_00 < 5) {
          if (n_00 == 4) {
            cftfsub(4,t,w);
          }
        }
        else {
          bitrv2(n_00,ip + 2,t);
          cftfsub(n_00,t,w);
          rftfsub(n_00,t,nc,c);
        }
        a[n - iVar14] = t[1] - *t;
        lVar10 = (long)iVar14;
        a[lVar10] = *t + t[1];
        uVar5 = (ulong)n_00;
        if (2 < n_00) {
          uVar11 = 2;
          lVar8 = (long)(iVar14 * 4);
          do {
            a[lVar8 - lVar10] = -t[uVar11] - t[uVar11 + 1];
            a[lVar10 + lVar8] = t[uVar11] - t[uVar11 + 1];
            uVar11 = uVar11 + 2;
            lVar8 = lVar8 + iVar14 * 4;
          } while (uVar11 < uVar5);
        }
        uVar6 = n_00 >> 1;
        if (3 < n_00) {
          lVar10 = -1;
          pdVar12 = t;
          do {
            dVar1 = pdVar12[uVar5 + 1];
            pdVar12[1] = t[uVar5 * 2 + lVar10] + dVar1;
            pdVar12 = pdVar12 + 1;
            t[uVar5 + lVar10] = t[uVar5 * 2 + lVar10] - dVar1;
            lVar10 = lVar10 + -1;
          } while (-lVar10 != (ulong)uVar6);
        }
        iVar14 = iVar14 * 2;
        *t = t[uVar6 + n_00];
        bVar4 = 3 < n_00;
        n_00 = uVar6;
      } while (bVar4);
      lVar10 = (long)iVar14;
    }
    a[lVar10] = *t;
  }
  *a = 0.0;
  return;
}

Assistant:

void dfst(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dstsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    if (n > 2) {
        m = n >> 1;
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] + a[n - j];
            xi = a[j] - a[n - j];
            yr = a[k] + a[n - k];
            yi = a[k] - a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi + yi;
            t[k] = xi - yi;
        }
        t[0] = a[mh] - a[n - mh];
        a[mh] += a[n - mh];
        a[0] = a[m];
        dstsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[1] - a[0];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] - a[j + 1];
            a[2 * j - 1] = -a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dstsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[1] - t[0];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = -t[j] - t[j + 1];
                a[k + l] = t[j] - t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 1; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] + t[m + j];
                t[k] = t[m + k] - t[m + j];
            }
            t[0] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
    }
    a[0] = 0;
}